

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O0

void __thiscall
AlignmentRecord::overlapMerge
          (AlignmentRecord *this,BamAlignment *alignment,string *dna,string *qualities,
          string *nucigar,vector<char,_std::allocator<char>_> *cigar_temp_unrolled,int *c_pos1,
          int *c_pos2,int *q_pos1,int *q_pos2,int *ref_pos)

{
  char cVar1;
  char cVar2;
  char cVar3;
  pair<char,_char> pVar4;
  const_reference pvVar5;
  reference pvVar6;
  char *pcVar7;
  string *in_RCX;
  string *in_RDX;
  long in_RSI;
  ShortDnaSequence *in_RDI;
  string *in_R8;
  vector<char,_std::allocator<char>_> *in_R9;
  int *in_stack_00000008;
  pair<char,_char> resPair;
  char c2;
  int *in_stack_00000010;
  char c1;
  size_t in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcc;
  undefined1 in_stack_ffffffffffffffcd;
  value_type vVar8;
  
  pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)(in_RDI + 1),(long)*in_stack_00000008);
  vVar8 = *pvVar5;
  pvVar6 = std::vector<char,_std::allocator<char>_>::operator[](in_R9,(long)*in_stack_00000010);
  cVar3 = *pvVar6;
  if ((((vVar8 == 'M') && (cVar3 == 'M')) || ((vVar8 == 'S' && (cVar3 == 'S')))) ||
     ((vVar8 == 'I' && (cVar3 == 'I')))) {
    if (vVar8 != 'S') {
      cVar1 = ShortDnaSequence::operator[](in_RDI,in_stack_ffffffffffffffb8);
      cVar2 = ShortDnaSequence::qualityChar(in_RDI,in_stack_ffffffffffffffb8);
      std::__cxx11::string::operator[](in_RSI + 0x28);
      std::__cxx11::string::operator[](in_RSI + 0x68);
      pVar4 = computeEntry((char *)in_R8,(char *)in_R9,
                           (char *)CONCAT17(vVar8,CONCAT16(cVar3,CONCAT15(in_stack_ffffffffffffffcd,
                                                                          CONCAT14(
                                                  in_stack_ffffffffffffffcc,
                                                  CONCAT13(cVar1,CONCAT12(cVar2,
                                                  in_stack_ffffffffffffffc8)))))),(char *)in_RDI);
      cVar3 = pVar4.second;
      std::__cxx11::string::operator+=(in_RDX,pVar4.first);
      std::__cxx11::string::operator+=(in_RCX,cVar3);
      std::__cxx11::string::operator+=(in_R8,vVar8);
    }
    if (vVar8 != 'I') {
      *(int *)qualities = *(int *)qualities + 1;
    }
    *(int *)&(cigar_temp_unrolled->super__Vector_base<char,_std::allocator<char>_>)._M_impl =
         *(int *)&(cigar_temp_unrolled->super__Vector_base<char,_std::allocator<char>_>)._M_impl + 1
    ;
    *(int *)nucigar = *(int *)nucigar + 1;
    *in_stack_00000008 = *in_stack_00000008 + 1;
    *in_stack_00000010 = *in_stack_00000010 + 1;
  }
  else if ((((vVar8 == 'D') && (cVar3 == 'D')) || ((vVar8 == 'H' && (cVar3 == 'H')))) ||
          ((((vVar8 == 'D' && (cVar3 == 'H')) || ((vVar8 == 'H' && (cVar3 == 'D')))) ||
           (((vVar8 == 'D' && (cVar3 == 'S')) || ((vVar8 == 'S' && (cVar3 == 'D')))))))) {
    *in_stack_00000008 = *in_stack_00000008 + 1;
    *in_stack_00000010 = *in_stack_00000010 + 1;
    *(int *)qualities = *(int *)qualities + 1;
    if ((vVar8 == 'D') || (cVar3 == 'D')) {
      std::__cxx11::string::operator+=(in_R8,'D');
    }
    if (vVar8 == 'S') {
      *(int *)&(cigar_temp_unrolled->super__Vector_base<char,_std::allocator<char>_>)._M_impl =
           *(int *)&(cigar_temp_unrolled->super__Vector_base<char,_std::allocator<char>_>)._M_impl +
           1;
    }
    else if (cVar3 == 'S') {
      *(int *)nucigar = *(int *)nucigar + 1;
    }
  }
  else if ((((vVar8 == 'M') && (((cVar3 == 'D' || (cVar3 == 'H')) || (cVar3 == 'S')))) ||
           ((((vVar8 == 'D' || (vVar8 == 'H')) || (vVar8 == 'S')) && (cVar3 == 'M')))) ||
          (((vVar8 == 'S' && (cVar3 == 'H')) || ((vVar8 == 'H' && (cVar3 == 'S')))))) {
    if (vVar8 == 'M') {
      std::__cxx11::string::operator+=(in_R8,'M');
      cVar1 = ShortDnaSequence::operator[](in_RDI,in_stack_ffffffffffffffb8);
      std::__cxx11::string::operator+=(in_RDX,cVar1);
      cVar1 = ShortDnaSequence::qualityChar(in_RDI,in_stack_ffffffffffffffb8);
      std::__cxx11::string::operator+=(in_RCX,cVar1);
      *(int *)qualities = *(int *)qualities + 1;
      *in_stack_00000008 = *in_stack_00000008 + 1;
      *in_stack_00000010 = *in_stack_00000010 + 1;
      *(int *)&(cigar_temp_unrolled->super__Vector_base<char,_std::allocator<char>_>)._M_impl =
           *(int *)&(cigar_temp_unrolled->super__Vector_base<char,_std::allocator<char>_>)._M_impl +
           1;
      if (cVar3 == 'S') {
        *(int *)nucigar = *(int *)nucigar + 1;
      }
    }
    else if (cVar3 == 'M') {
      std::__cxx11::string::operator+=(in_R8,'M');
      pcVar7 = (char *)std::__cxx11::string::operator[](in_RSI + 0x28);
      std::__cxx11::string::operator+=(in_RDX,*pcVar7);
      pcVar7 = (char *)std::__cxx11::string::operator[](in_RSI + 0x68);
      std::__cxx11::string::operator+=(in_RCX,*pcVar7);
      *(int *)qualities = *(int *)qualities + 1;
      *in_stack_00000008 = *in_stack_00000008 + 1;
      *in_stack_00000010 = *in_stack_00000010 + 1;
      *(int *)nucigar = *(int *)nucigar + 1;
      if (vVar8 == 'S') {
        *(int *)&(cigar_temp_unrolled->super__Vector_base<char,_std::allocator<char>_>)._M_impl =
             *(int *)&(cigar_temp_unrolled->super__Vector_base<char,_std::allocator<char>_>)._M_impl
             + 1;
      }
    }
    else if (vVar8 == 'S') {
      *(int *)qualities = *(int *)qualities + 1;
      *in_stack_00000008 = *in_stack_00000008 + 1;
      *in_stack_00000010 = *in_stack_00000010 + 1;
      *(int *)&(cigar_temp_unrolled->super__Vector_base<char,_std::allocator<char>_>)._M_impl =
           *(int *)&(cigar_temp_unrolled->super__Vector_base<char,_std::allocator<char>_>)._M_impl +
           1;
    }
    else {
      *(int *)qualities = *(int *)qualities + 1;
      *in_stack_00000008 = *in_stack_00000008 + 1;
      *in_stack_00000010 = *in_stack_00000010 + 1;
      *(int *)nucigar = *(int *)nucigar + 1;
    }
  }
  else if ((vVar8 == 'I') || (cVar3 == 'I')) {
    if (vVar8 == 'I') {
      std::__cxx11::string::operator+=(in_R8,'I');
      cVar3 = ShortDnaSequence::operator[](in_RDI,in_stack_ffffffffffffffb8);
      std::__cxx11::string::operator+=(in_RDX,cVar3);
      cVar3 = ShortDnaSequence::qualityChar(in_RDI,in_stack_ffffffffffffffb8);
      std::__cxx11::string::operator+=(in_RCX,cVar3);
      *in_stack_00000008 = *in_stack_00000008 + 1;
      *(int *)&(cigar_temp_unrolled->super__Vector_base<char,_std::allocator<char>_>)._M_impl =
           *(int *)&(cigar_temp_unrolled->super__Vector_base<char,_std::allocator<char>_>)._M_impl +
           1;
    }
    else {
      std::__cxx11::string::operator+=(in_R8,'I');
      pcVar7 = (char *)std::__cxx11::string::operator[](in_RSI + 0x28);
      std::__cxx11::string::operator+=(in_RDX,*pcVar7);
      pcVar7 = (char *)std::__cxx11::string::operator[](in_RSI + 0x68);
      std::__cxx11::string::operator+=(in_RCX,*pcVar7);
      *in_stack_00000010 = *in_stack_00000010 + 1;
      *(int *)nucigar = *(int *)nucigar + 1;
    }
  }
  return;
}

Assistant:

void AlignmentRecord::overlapMerge(const BamTools::BamAlignment& alignment, std::string& dna, std::string& qualities, std::string& nucigar, std::vector<char>& cigar_temp_unrolled, int& c_pos1, int& c_pos2, int& q_pos1, int& q_pos2, int& ref_pos) const{
    char c1 = this->cigar1_unrolled[c_pos1];
    char c2 = cigar_temp_unrolled[c_pos2];
    if((c1 == 'M' && c2 == 'M') || (c1 == 'S' && c2 == 'S') || (c1 == 'I' && c2 == 'I')){
        if (c1 != 'S'){
            std::pair<char,char> resPair = computeEntry(this->sequence1[q_pos1],this->sequence1.qualityChar(q_pos1),alignment.QueryBases[q_pos2],alignment.Qualities[q_pos2]);
            dna += resPair.first;
            qualities += resPair.second;
            nucigar += c1;
        }
        if (c1 != 'I') ref_pos++;
        q_pos1++;
        q_pos2++;
        c_pos1++;
        c_pos2++;
    } else if ((c1 == 'D' && c2 == 'D') || (c1 == 'H' && c2 == 'H') || (c1 == 'D' && c2 == 'H') || (c1 == 'H' && c2 == 'D') || (c1 == 'D' && c2 == 'S') || (c1 == 'S' && c2 == 'D')){
        c_pos1++;
        c_pos2++;
        ref_pos++;
        if (c1 == 'D' || c2 == 'D'){
            nucigar += 'D';
        }
        if (c1 == 'S'){
            q_pos1++;
        } else if(c2 == 'S'){
            q_pos2++;
        }
    } else if ((c1 == 'M' && (c2 == 'D' || c2 == 'H' || c2 == 'S')) || ((c1 == 'D' || c1 == 'H' || c1 == 'S') && c2 == 'M') || (c1 == 'S' && c2 == 'H') || (c1 == 'H' && c2 == 'S')) {
        if (c1 == 'M'){
            nucigar += 'M';
            dna += this->sequence1[q_pos1];
            qualities += this->sequence1.qualityChar(q_pos1);
            ref_pos++;
            c_pos1++;
            c_pos2++;
            q_pos1++;
            if (c2 == 'S') q_pos2++;
        } else if (c2 == 'M'){
            nucigar += 'M';
            dna +=  alignment.QueryBases[q_pos2];
            qualities += alignment.Qualities[q_pos2];
            ref_pos++;
            c_pos1++;
            c_pos2++;
            q_pos2++;
            if (c1 == 'S') q_pos1++;
        } else if (c1 == 'S'){
            ref_pos++;
            c_pos1++;
            c_pos2++;
            q_pos1++;
        } else {
            ref_pos++;
            c_pos1++;
            c_pos2++;
            q_pos2++;
        }
    } else if (c1 == 'I' || c2 == 'I'){
        if(c1 == 'I'){
            nucigar += 'I';
            dna += this->sequence1[q_pos1];
            qualities += this->sequence1.qualityChar(q_pos1);
            c_pos1++;
            q_pos1++;
        } else {
            nucigar += 'I';
            dna +=  alignment.QueryBases[q_pos2];
            qualities += alignment.Qualities[q_pos2];
            c_pos2++;
            q_pos2++;
        }
    } else {
        assert(false);
    }
}